

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_crop.cpp
# Opt level: O0

int test_crop(Mat *a,Mat *starts,Mat *ends,Mat *axes)

{
  int iVar1;
  long in_RDI;
  int ret;
  Option opt;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> weights;
  ParamDict pd;
  int in_stack_fffffffffffff65c;
  Option *in_stack_fffffffffffff660;
  Mat *a_00;
  allocator_type *__a;
  undefined1 *__n;
  undefined4 in_stack_fffffffffffff680;
  undefined4 in_stack_fffffffffffff684;
  undefined2 in_stack_fffffffffffff6a0;
  undefined1 in_stack_fffffffffffff6a2;
  undefined1 in_stack_fffffffffffff6a3;
  undefined4 in_stack_fffffffffffff6a4;
  allocator_type local_949 [41];
  undefined1 local_920 [504];
  _func_void_Crop_ptr *in_stack_fffffffffffff8d8;
  float in_stack_fffffffffffff8e4;
  Mat *in_stack_fffffffffffff8e8;
  Option *in_stack_fffffffffffff8f0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffff8f8;
  ParamDict *in_stack_fffffffffffff900;
  char *in_stack_fffffffffffff908;
  
  __n = local_920;
  ncnn::ParamDict::ParamDict
            ((ParamDict *)
             CONCAT44(in_stack_fffffffffffff6a4,
                      CONCAT13(in_stack_fffffffffffff6a3,
                               CONCAT12(in_stack_fffffffffffff6a2,in_stack_fffffffffffff6a0))));
  ncnn::ParamDict::set
            ((ParamDict *)in_stack_fffffffffffff660,in_stack_fffffffffffff65c,(Mat *)0x119a50);
  ncnn::ParamDict::set
            ((ParamDict *)in_stack_fffffffffffff660,in_stack_fffffffffffff65c,(Mat *)0x119a6c);
  ncnn::ParamDict::set
            ((ParamDict *)in_stack_fffffffffffff660,in_stack_fffffffffffff65c,(Mat *)0x119a88);
  __a = local_949;
  std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x119a99);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
             CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),(size_type)__n,__a);
  std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x119ab8);
  ncnn::Option::Option(in_stack_fffffffffffff660);
  iVar1 = test_layer<ncnn::Crop>
                    (in_stack_fffffffffffff908,in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
                     in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e4,
                     in_stack_fffffffffffff8d8);
  if (iVar1 != 0) {
    a_00 = (Mat *)&stderr;
    fprintf(_stderr,"test_crop failed a.dims=%d a=(%d %d %d)",(ulong)*(uint *)(in_RDI + 0x28),
            (ulong)*(uint *)(in_RDI + 0x2c),(ulong)*(uint *)(in_RDI + 0x30),
            (ulong)*(uint *)(in_RDI + 0x34));
    fprintf((FILE *)a_00->data," starts=");
    print_int_array(a_00);
    fprintf(_stderr," ends=");
    print_int_array(a_00);
    fprintf(_stderr," axes=");
    print_int_array(a_00);
    fprintf(_stderr,"\n");
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)__a);
  ncnn::ParamDict::~ParamDict((ParamDict *)__a);
  return iVar1;
}

Assistant:

static int test_crop(const ncnn::Mat& a, const ncnn::Mat& starts, const ncnn::Mat& ends, const ncnn::Mat& axes)
{
    ncnn::ParamDict pd;
    pd.set(9, starts);// starts
    pd.set(10, ends);// ends
    pd.set(11, axes);// axes

    std::vector<ncnn::Mat> weights(0);

    ncnn::Option opt;
    opt.num_threads = 1;
    opt.use_vulkan_compute = true;
    opt.use_int8_inference = false;

    int ret = test_layer<ncnn::Crop>("Crop", pd, weights, opt, a);
    if (ret != 0)
    {
        fprintf(stderr, "test_crop failed a.dims=%d a=(%d %d %d)", a.dims, a.w, a.h, a.c);
        fprintf(stderr, " starts="); print_int_array(starts);
        fprintf(stderr, " ends="); print_int_array(ends);
        fprintf(stderr, " axes="); print_int_array(axes);
        fprintf(stderr, "\n");
    }

    return ret;
}